

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  uint uVar1;
  CollSeq *data;
  void *p;
  CollSeq *pCVar2;
  
  if (zName == (char *)0x0) {
    data = db->pDfltColl;
  }
  else {
    data = (CollSeq *)sqlite3HashFind(&db->aCollSeq,zName);
    if (create != 0 && data == (CollSeq *)0x0) {
      uVar1 = sqlite3Strlen30(zName);
      data = (CollSeq *)sqlite3DbMallocZero(db,(ulong)uVar1 + 0x79);
      if (data != (CollSeq *)0x0) {
        pCVar2 = data + 3;
        data->zName = (char *)pCVar2;
        data->enc = '\x01';
        data[1].zName = (char *)pCVar2;
        data[1].enc = '\x02';
        data[2].zName = (char *)pCVar2;
        data[2].enc = '\x03';
        memcpy(pCVar2,zName,(ulong)uVar1 + 1);
        p = sqlite3HashInsert(&db->aCollSeq,(char *)pCVar2,data);
        if (p == (void *)0x0) goto LAB_002505c2;
        sqlite3OomFault(db);
        sqlite3DbFreeNN(db,p);
      }
      data = (CollSeq *)0x0;
    }
  }
LAB_002505c2:
  pCVar2 = data + ((ulong)enc - 1);
  if (data == (CollSeq *)0x0) {
    pCVar2 = (CollSeq *)0x0;
  }
  return pCVar2;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,
  u8 enc,
  const char *zName,
  int create
){
  CollSeq *pColl;
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
  }else{
    pColl = db->pDfltColl;
  }
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( pColl ) pColl += enc-1;
  return pColl;
}